

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_curse_msg(parser *p)

{
  void *pvVar1;
  char *s2;
  char *pcVar2;
  curse *curse;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar2 = *(char **)(*(long *)((long)pvVar1 + 0x18) + 0x108);
    s2 = parser_getstr(p,"text");
    pcVar2 = string_append(pcVar2,s2);
    *(char **)(*(long *)((long)pvVar1 + 0x18) + 0x108) = pcVar2;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_curse_msg(struct parser *p) {
	struct curse *curse = parser_priv(p);

	if (!curse) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	curse->obj->effect_msg = string_append(curse->obj->effect_msg,
		parser_getstr(p, "text"));
	return PARSE_ERROR_NONE;
}